

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

duplicate_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>::
operator<<(specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error> *this,
          char *val)

{
  long in_RSI;
  duplicate_param *in_RDI;
  duplicate_param *in_stack_ffffffffffffffc8;
  duplicate_param *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::append((char *)(in_RSI + 0x18));
  duplicate_param::duplicate_param(this_00,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }